

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

void __thiscall
CorUnix::CPalSynchronizationManager::CPalSynchronizationManager(CPalSynchronizationManager *this)

{
  (this->super_IPalSynchronizationManager)._vptr_IPalSynchronizationManager =
       (_func_int **)&PTR_BlockThread_00188898;
  this->m_dwWorkerThreadTid = 0;
  this->m_pipoThread = (IPalObject *)0x0;
  this->m_pthrWorker = (CPalThread *)0x0;
  this->m_iProcessPipeRead = -1;
  this->m_iProcessPipeWrite = -1;
  this->m_pmplnMonitoredProcesses = (MonitoredProcessesListNode *)0x0;
  this->m_lMonitoredProcessesCount = 0;
  this->m_pmplnExitedNodes = (MonitoredProcessesListNode *)0x0;
  (this->m_cacheWaitCtrlrs).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheWaitCtrlrs).m_iDepth.m_val = 0;
  (this->m_cacheWaitCtrlrs).m_iMaxDepth = 0x100;
  (this->m_cacheWaitCtrlrs).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheWaitCtrlrs).m_cs);
  if ((this->m_cacheWaitCtrlrs).m_iMaxDepth < 0) {
    (this->m_cacheWaitCtrlrs).m_iMaxDepth = 0;
  }
  (this->m_cacheStateCtrlrs).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheStateCtrlrs).m_iDepth.m_val = 0;
  (this->m_cacheStateCtrlrs).m_iMaxDepth = 0x100;
  (this->m_cacheStateCtrlrs).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheStateCtrlrs).m_cs);
  if ((this->m_cacheStateCtrlrs).m_iMaxDepth < 0) {
    (this->m_cacheStateCtrlrs).m_iMaxDepth = 0;
  }
  (this->m_cacheSynchData).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheSynchData).m_iDepth.m_val = 0;
  (this->m_cacheSynchData).m_iMaxDepth = 0x100;
  (this->m_cacheSynchData).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheSynchData).m_cs);
  if ((this->m_cacheSynchData).m_iMaxDepth < 0) {
    (this->m_cacheSynchData).m_iMaxDepth = 0;
  }
  (this->m_cacheSHRSynchData).m_pHead.m_val = (_USHRSynchCacheStackNode *)0x0;
  (this->m_cacheSHRSynchData).m_iDepth.m_val = 0;
  (this->m_cacheSHRSynchData).m_iMaxDepth = 0x100;
  (this->m_cacheSHRSynchData).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheSHRSynchData).m_cs);
  if ((this->m_cacheSHRSynchData).m_iMaxDepth < 0) {
    (this->m_cacheSHRSynchData).m_iMaxDepth = 0;
  }
  (this->m_cacheWTListNodes).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheWTListNodes).m_iDepth.m_val = 0;
  (this->m_cacheWTListNodes).m_iMaxDepth = 0x100;
  (this->m_cacheWTListNodes).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheWTListNodes).m_cs);
  if ((this->m_cacheWTListNodes).m_iMaxDepth < 0) {
    (this->m_cacheWTListNodes).m_iMaxDepth = 0;
  }
  (this->m_cacheSHRWTListNodes).m_pHead.m_val = (_USHRSynchCacheStackNode *)0x0;
  (this->m_cacheSHRWTListNodes).m_iDepth.m_val = 0;
  (this->m_cacheSHRWTListNodes).m_iMaxDepth = 0x100;
  (this->m_cacheSHRWTListNodes).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheSHRWTListNodes).m_cs);
  if ((this->m_cacheSHRWTListNodes).m_iMaxDepth < 0) {
    (this->m_cacheSHRWTListNodes).m_iMaxDepth = 0;
  }
  (this->m_cacheThreadApcInfoNodes).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheThreadApcInfoNodes).m_iDepth.m_val = 0;
  (this->m_cacheThreadApcInfoNodes).m_iMaxDepth = 0x20;
  (this->m_cacheThreadApcInfoNodes).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheThreadApcInfoNodes).m_cs);
  if ((this->m_cacheThreadApcInfoNodes).m_iMaxDepth < 0) {
    (this->m_cacheThreadApcInfoNodes).m_iMaxDepth = 0;
  }
  (this->m_cacheOwnedObjectsListNodes).m_pHead.m_val = (_USynchCacheStackNode *)0x0;
  (this->m_cacheOwnedObjectsListNodes).m_iDepth.m_val = 0;
  (this->m_cacheOwnedObjectsListNodes).m_iMaxDepth = 0x10;
  (this->m_cacheOwnedObjectsListNodes).m_iMaxTrackedDepth = 0;
  InternalInitializeCriticalSection(&(this->m_cacheOwnedObjectsListNodes).m_cs);
  if ((this->m_cacheOwnedObjectsListNodes).m_iMaxDepth < 0) {
    (this->m_cacheOwnedObjectsListNodes).m_iMaxDepth = 0;
  }
  return;
}

Assistant:

CPalSynchronizationManager::CPalSynchronizationManager()
        : m_dwWorkerThreadTid(0),
          m_pipoThread(NULL),
          m_pthrWorker(NULL),
          m_iProcessPipeRead(-1),
          m_iProcessPipeWrite(-1),
          m_pmplnMonitoredProcesses(NULL),
          m_lMonitoredProcessesCount(0),
          m_pmplnExitedNodes(NULL),
          m_cacheWaitCtrlrs(CtrlrsCacheMaxSize),
          m_cacheStateCtrlrs(CtrlrsCacheMaxSize),
          m_cacheSynchData(SynchDataCacheMaxSize),
          m_cacheSHRSynchData(SynchDataCacheMaxSize),
          m_cacheWTListNodes(WTListNodeCacheMaxSize),
          m_cacheSHRWTListNodes(WTListNodeCacheMaxSize),
          m_cacheThreadApcInfoNodes(ApcInfoNodeCacheMaxSize),
          m_cacheOwnedObjectsListNodes(OwnedObjectsListCacheMaxSize)
    {
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        m_iKQueue = -1;
        // Initialize data to 0 and flags to EV_EOF
        EV_SET(&m_keProcessPipeEvent, 0, 0, EV_EOF, 0, 0, 0);
#endif // HAVE_KQUEUE
    }